

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void AddTail<stTimeoutItem_t,stTimeoutItemLink_t>(stTimeoutItemLink_t *apLink,stTimeoutItem_t *ap)

{
  stTimeoutItem_t *psVar1;
  stTimeoutItemLink_t *psVar2;
  
  if (ap->pLink != (stTimeoutItemLink_t *)0x0) {
    return;
  }
  psVar1 = apLink->tail;
  psVar2 = (stTimeoutItemLink_t *)&psVar1->pNext;
  if (psVar1 == (stTimeoutItem_t *)0x0) {
    psVar2 = apLink;
  }
  psVar2->head = ap;
  apLink->tail = ap;
  ap->pPrev = psVar1;
  ap->pNext = (stTimeoutItem_t *)0x0;
  ap->pLink = apLink;
  return;
}

Assistant:

void inline AddTail(TLink*apLink,TNode *ap)
{
	if( ap->pLink )
	{
		return ;
	}
	if(apLink->tail)
	{
		apLink->tail->pNext = (TNode*)ap;
		ap->pNext = NULL;
		ap->pPrev = apLink->tail;
		apLink->tail = ap;
	}
	else
	{
		apLink->head = apLink->tail = ap;
		ap->pNext = ap->pPrev = NULL;
	}
	ap->pLink = apLink;
}